

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  pointer *pp_Var1;
  pointer *this_00;
  pointer *this_01;
  HalfedgeIter HVar2;
  HalfedgeIter HVar3;
  VertexIter VVar4;
  EdgeIter EVar5;
  size_t sVar6;
  bool bVar7;
  pointer pFVar8;
  Size SVar9;
  HalfedgeIter *pHVar10;
  pointer pHVar11;
  reference this_02;
  VertexIter *__x;
  reference pvVar12;
  reference pvVar13;
  pointer this_03;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  FaceIter *pFVar17;
  undefined1 *local_168;
  size_t i_2;
  size_t t;
  size_t third_v;
  size_t second_v;
  size_t first_v;
  undefined1 *local_118;
  size_t i_1;
  value_type local_108;
  value_type local_100;
  value_type local_f8;
  undefined1 *local_f0;
  size_t i;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_new_vec;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_new_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_twin_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_vec;
  _List_iterator<CMU462::Halfedge> *hi;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  undefined1 local_40 [8];
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_vec;
  size_t degree;
  HalfedgeIter h;
  HalfedgeMesh *this_local;
  FaceIter f_local;
  
  h._M_node = (_List_node_base *)this;
  this_local = (HalfedgeMesh *)f._M_node;
  pFVar8 = std::_List_iterator<CMU462::Face>::operator->
                     ((_List_iterator<CMU462::Face> *)&this_local);
  SVar9 = Face::degree(pFVar8);
  if (SVar9 != 3) {
    pFVar8 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)&this_local);
    pHVar10 = Face::halfedge(pFVar8);
    degree = (size_t)pHVar10->_M_node;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)local_40);
    do {
      h_outer_vec.
      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(h_outer_vec.
                             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_node + 1);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)local_40,(value_type *)&degree);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)&degree);
      pHVar10 = Halfedge::next(pHVar11);
      degree = (size_t)pHVar10->_M_node;
      pFVar8 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)&this_local);
      pHVar10 = Face::halfedge(pFVar8);
      bVar7 = std::operator!=((_Self *)&degree,pHVar10);
    } while (bVar7);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              *)&__range1);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::reserve((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               *)&__range1,
              (size_type)
              h_outer_vec.
              super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end1 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      *)local_40);
    hi = (_List_iterator<CMU462::Halfedge> *)
         std::
         vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ::end((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                *)local_40);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                                       *)&hi), bVar7) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                ::operator*(&__end1);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(this_02);
      __x = Halfedge::vertex(pHVar11);
      std::
      vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   *)&__range1,__x);
      __gnu_cxx::
      __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
      ::operator++(&__end1);
    }
    pp_Var1 = &h_new_twin_vec.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)pp_Var1);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)&e_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)pp_Var1,
              (size_type)
              ((long)&h_outer_vec.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5));
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&e_new_vec.
                  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (size_type)
              ((long)&h_outer_vec.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5));
    this_00 = &f_new_vec.
               super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
            *)this_00);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    reserve((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)this_00,
            (size_type)
            ((long)&h_outer_vec.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5));
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
            *)&i);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    reserve((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             *)&i,(size_type)
                  ((long)&h_outer_vec.
                          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5));
    for (local_f0 = (undefined1 *)0x0;
        local_f0 <
        (undefined1 *)
        ((long)&h_outer_vec.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5U);
        local_f0 = local_f0 + 1) {
      local_f8._M_node = (_List_node_base *)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&h_new_twin_vec.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
      local_100._M_node = (_List_node_base *)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&e_new_vec.
                      super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_100);
      local_108._M_node = (_List_node_base *)newEdge(this);
      std::
      vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   *)&f_new_vec.
                      super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
      i_1 = (size_t)newFace(this);
      std::
      vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                   *)&i,(value_type *)&i_1);
    }
    for (local_118 = (undefined1 *)0x0;
        local_118 <
        (undefined1 *)
        ((long)&h_outer_vec.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 5U);
        local_118 = local_118 + 1) {
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)&h_new_twin_vec.
                                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)local_118);
      pvVar13 = std::
                vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                              *)&f_new_vec.
                                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)local_118);
      this_03 = std::_List_iterator<CMU462::Edge>::operator->(pvVar13);
      pHVar10 = Edge::halfedge(this_03);
      pHVar10->_M_node = pvVar12->_M_node;
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)&e_new_vec.
                                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)local_118);
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                              *)&i,(size_type)local_118);
      pFVar8 = std::_List_iterator<CMU462::Face>::operator->(pvVar14);
      pHVar10 = Face::halfedge(pFVar8);
      pHVar10->_M_node = pvVar12->_M_node;
    }
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&h_new_twin_vec.
                               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)local_40,0);
    HVar2._M_node = pvVar12->_M_node;
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&e_new_vec.
                               super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    HVar3._M_node = pvVar12->_M_node;
    pvVar15 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                            *)&__range1,2);
    VVar4._M_node = pvVar15->_M_node;
    pvVar13 = std::
              vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                            *)&f_new_vec.
                               super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,pvVar13->_M_node,(FaceIter)this_local);
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&h_new_twin_vec.
                               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pvVar16 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)local_40,1);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar16);
    pHVar10 = Halfedge::next(pHVar11);
    pHVar10->_M_node = pvVar12->_M_node;
    second_v = 0;
    third_v = 2;
    t = (long)&h_outer_vec.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 7;
    for (local_168 = (undefined1 *)0x0; sVar6 = t,
        local_168 <
        (undefined1 *)
        ((long)&h_outer_vec.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_node + 4U);
        local_168 = local_168 + 1) {
      if (((ulong)local_168 & 1) == 0) {
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&e_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        pp_Var1 = &h_new_twin_vec.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)pp_Var1,(size_type)(local_168 + 1));
        HVar2._M_node = pvVar12->_M_node;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)pp_Var1,(size_type)local_168);
        HVar3._M_node = pvVar12->_M_node;
        pvVar15 = std::
                  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                                *)&__range1,second_v);
        VVar4._M_node = pvVar15->_M_node;
        pvVar13 = std::
                  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                *)&f_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        EVar5._M_node = pvVar13->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&h_new_twin_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,t);
        HVar2._M_node = pvVar12->_M_node;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&e_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        HVar3._M_node = pvVar12->_M_node;
        pvVar15 = std::
                  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                                *)&__range1,third_v);
        VVar4._M_node = pvVar15->_M_node;
        pvVar13 = std::
                  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                *)&f_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        EVar5._M_node = pvVar13->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&e_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        pvVar16 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,t);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar16);
        pHVar10 = Halfedge::next(pHVar11);
        pHVar10->_M_node = pvVar12->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,t);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        pFVar17 = Halfedge::face(pHVar11);
        pFVar17->_M_node = pvVar14->_M_node;
        t = third_v + 1;
      }
      else {
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&h_new_twin_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        this_01 = &e_new_vec.
                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)this_01,(size_type)local_168);
        HVar2._M_node = pvVar12->_M_node;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)this_01,(size_type)(local_168 + 1));
        HVar3._M_node = pvVar12->_M_node;
        pvVar15 = std::
                  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                                *)&__range1,t);
        VVar4._M_node = pvVar15->_M_node;
        pvVar13 = std::
                  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                *)&f_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        EVar5._M_node = pvVar13->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&e_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,second_v);
        HVar2._M_node = pvVar12->_M_node;
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&h_new_twin_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        HVar3._M_node = pvVar12->_M_node;
        pvVar15 = std::
                  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                                *)&__range1,third_v);
        VVar4._M_node = pvVar15->_M_node;
        pvVar13 = std::
                  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                *)&f_new_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)local_168);
        EVar5._M_node = pvVar13->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)&h_new_twin_vec.
                                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)(local_168 + 1));
        pvVar16 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,second_v);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar16);
        pHVar10 = Halfedge::next(pHVar11);
        pHVar10->_M_node = pvVar12->_M_node;
        pvVar14 = std::
                  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                                *)&i,(size_type)local_168);
        pvVar12 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                *)local_40,second_v);
        pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
        pFVar17 = Halfedge::face(pHVar11);
        pFVar17->_M_node = pvVar14->_M_node;
        t = third_v - 1;
      }
      second_v = third_v;
      third_v = sVar6;
    }
    if (((ulong)h_outer_vec.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&e_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,third_v);
      HVar2._M_node = pvVar12->_M_node;
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&h_new_twin_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HVar3._M_node = pvVar12->_M_node;
      pvVar15 = std::
                vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                              *)&__range1,second_v);
      VVar4._M_node = pvVar15->_M_node;
      pvVar13 = std::
                vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                        *)&f_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      EVar5._M_node = pvVar13->_M_node;
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,third_v);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pFVar17 = Halfedge::face(pHVar11);
      pFVar17->_M_node = pvVar14->_M_node;
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,t);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pFVar17 = Halfedge::face(pHVar11);
      pFVar17->_M_node = pvVar14->_M_node;
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&e_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar16 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,t);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar16);
      pHVar10 = Halfedge::next(pHVar11);
      pHVar10->_M_node = pvVar12->_M_node;
    }
    else {
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&e_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,second_v);
      HVar2._M_node = pvVar12->_M_node;
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&h_new_twin_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HVar3._M_node = pvVar12->_M_node;
      pvVar15 = std::
                vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                              *)&__range1,third_v);
      VVar4._M_node = pvVar15->_M_node;
      pvVar13 = std::
                vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                        *)&f_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      EVar5._M_node = pvVar13->_M_node;
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      Halfedge::setNeighbors(pHVar11,HVar2,HVar3,VVar4,EVar5,pvVar14->_M_node);
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,second_v);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pFVar17 = Halfedge::face(pHVar11);
      pFVar17->_M_node = pvVar14->_M_node;
      pvVar14 = std::
                vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ::back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                        *)&i);
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,t);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar12);
      pFVar17 = Halfedge::face(pHVar11);
      pFVar17->_M_node = pvVar14->_M_node;
      pvVar12 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        *)&e_new_vec.
                           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar16 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)local_40,t);
      pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar16);
      pHVar10 = Halfedge::next(pHVar11);
      pHVar10->_M_node = pvVar12->_M_node;
    }
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    ~vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             *)&i);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    ~vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)&f_new_vec.
                super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&e_new_vec.
                  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&h_new_twin_vec.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               *)&__range1);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)local_40);
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
  // Triangulate a polygonal face

  // If already triangle, return
  if (f->degree() == 3) {
    return;
  }

  // Collect
  // HalfEdges
  auto h = f->halfedge();
  size_t degree = 0;
  vector<HalfedgeIter> h_outer_vec;
  do {
    ++degree;
    h_outer_vec.push_back(h);
    h = h->next();
  } while (h != f->halfedge());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.reserve(degree);
  for (const auto& hi : h_outer_vec) {
    v_outer_vec.push_back(hi->vertex());
  }

  // Allocate
  // HalfEdges
  vector<HalfedgeIter> h_new_vec, h_new_twin_vec;
  h_new_vec.reserve(degree - 3);
  h_new_twin_vec.reserve(degree - 3);

  // Edges
  vector<EdgeIter> e_new_vec;
  e_new_vec.reserve(degree - 3);

  // Faces
  vector<FaceIter> f_new_vec;
  f_new_vec.reserve(degree - 3);

  for (size_t i = 0; i < degree - 3; ++i) {
    h_new_vec.push_back(newHalfedge());
    h_new_twin_vec.push_back(newHalfedge());

    e_new_vec.push_back(newEdge());

    f_new_vec.push_back(newFace());
  }

  // Reassign
  // New edges and faces
  for (size_t i = 0; i < degree - 3; ++i) {
    e_new_vec[i]->halfedge() = h_new_vec[i];
    f_new_vec[i]->halfedge() = h_new_twin_vec[i];
  }

  // Halfedges of the first face
  h_new_vec[0]->setNeighbors(h_outer_vec[0],
                             h_new_twin_vec[0],
                             v_outer_vec[2],
                             e_new_vec[0],
                             f);
  h_outer_vec[1]->next() = h_new_vec[0];

  // Halfedges of the middle faces
  size_t first_v = 0, second_v = 2, third_v = degree - 1, t;
  for (size_t i = 0; i < degree - 4; ++i) {
    if (i % 2 == 0) {
      h_new_twin_vec[i]->setNeighbors(h_new_vec[i + 1],
                                      h_new_vec[i],
                                      v_outer_vec[first_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_new_vec[i + 1]->setNeighbors(h_outer_vec[third_v],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[second_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_outer_vec[third_v]->next() = h_new_twin_vec[i];
      h_outer_vec[third_v]->face() = f_new_vec[i];
      t = second_v + 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    } else {
      h_new_vec[i + 1]->setNeighbors(h_new_twin_vec[i],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[third_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_new_twin_vec[i]->setNeighbors(h_outer_vec[first_v],
                                      h_new_vec[i],
                                      v_outer_vec[second_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_outer_vec[first_v]->next() = h_new_vec[i + 1];
      h_outer_vec[first_v]->face() = f_new_vec[i];
      t = second_v - 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    }
  }

  // Halfedges of the final faces
  if (degree % 2 == 0) {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[second_v],
                                        h_new_vec.back(),
                                        v_outer_vec[first_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[second_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  } else {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[first_v],
                                        h_new_vec.back(),
                                        v_outer_vec[second_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[first_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  }
}